

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnRethrow(TypeChecker *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Label *label;
  
  RVar1 = GetRethrowLabel(this,depth,&label);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    RVar1 = SetUnreachable(this);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::OnRethrow(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetRethrowLabel(depth, &label));
  CHECK_RESULT(SetUnreachable());
  return result;
}